

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

Token * __thiscall YAML::Scanner::PushToken(Scanner *this,TYPE type)

{
  _Elt_pointer pTVar1;
  Token local_60;
  
  local_60.mark.pos = (this->INPUT).m_mark.pos;
  local_60.mark.line = (this->INPUT).m_mark.line;
  local_60.mark.column = (this->INPUT).m_mark.column;
  local_60.value._M_dataplus._M_p = (pointer)&local_60.value.field_2;
  local_60.status = VALID;
  local_60.value._M_string_length = 0;
  local_60.value.field_2._M_local_buf[0] = '\0';
  local_60.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_60._76_8_ = 0;
  local_60.type = type;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_60);
  Token::~Token(&local_60);
  pTVar1 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pTVar1 == (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pTVar1 = (this->m_tokens).c.super__Deque_base<YAML::Token,_std::allocator<YAML::Token>_>._M_impl
             .super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  return pTVar1 + -1;
}

Assistant:

Token* Scanner::PushToken(Token::TYPE type) {
  m_tokens.push(Token(type, INPUT.mark()));
  return &m_tokens.back();
}